

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O0

TPZSkylMatrix<std::complex<double>_> * __thiscall
TPZSkylMatrix<std::complex<double>_>::operator-=
          (TPZSkylMatrix<std::complex<double>_> *this,TPZSkylMatrix<std::complex<double>_> *A)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  long *in_RSI;
  TPZSkylMatrix<std::complex<double>_> *in_RDI;
  char *in_stack_00000168;
  char *in_stack_00000170;
  TPZSkylMatrix<std::complex<double>_> *A_00;
  TPZSkylMatrix<std::complex<double>_> *in_stack_ffffffffffffffc0;
  TPZSkylMatrix<std::complex<double>_> *in_stack_ffffffffffffffc8;
  
  iVar1 = (*(in_RDI->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])();
  lVar2 = (**(code **)(*in_RSI + 0x60))();
  if (CONCAT44(extraout_var,iVar1) != lVar2) {
    TPZMatrix<std::complex<double>_>::Error(in_stack_00000170,in_stack_00000168);
  }
  A_00 = (TPZSkylMatrix<std::complex<double>_> *)&stack0xffffffffffffff90;
  operator-(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  operator=(in_RDI,A_00);
  ~TPZSkylMatrix((TPZSkylMatrix<std::complex<double>_> *)0x137aaf2);
  return in_RDI;
}

Assistant:

TPZSkylMatrix<TVar> &
TPZSkylMatrix<TVar>::operator-=(const TPZSkylMatrix<TVar> &A )
{
  if ( this->Dim() != A.Dim() )
		TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__,"operator+=( TPZSkylMatrix ) <incompatible dimensions>" );

	*this = *this - A;
	return *this;
}